

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O2

void __thiscall
QtPrivate::QGenericArrayOps<QPostEvent>::moveAppend
          (QGenericArrayOps<QPostEvent> *this,QPostEvent *b,QPostEvent *e)

{
  qsizetype *pqVar1;
  QPostEvent *pQVar2;
  long lVar3;
  QEvent *pQVar4;
  QPostEvent *pQVar5;
  undefined4 uVar6;
  
  if (b != e) {
    pQVar2 = (this->super_QArrayDataPointer<QPostEvent>).ptr;
    for (; b < e; b = b + 1) {
      lVar3 = (this->super_QArrayDataPointer<QPostEvent>).size;
      uVar6 = *(undefined4 *)&b->field_0x14;
      pQVar5 = pQVar2 + lVar3;
      pQVar5->priority = b->priority;
      *(undefined4 *)&pQVar5->field_0x14 = uVar6;
      pQVar4 = b->event;
      pQVar5 = pQVar2 + lVar3;
      pQVar5->receiver = b->receiver;
      pQVar5->event = pQVar4;
      pqVar1 = &(this->super_QArrayDataPointer<QPostEvent>).size;
      *pqVar1 = *pqVar1 + 1;
    }
  }
  return;
}

Assistant:

void moveAppend(T *b, T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e)
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(std::move(*b));
            ++b;
            ++this->size;
        }
    }